

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::MapHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  anon_class_24_1_2f014396_conflict3 implicitCall;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Var pvVar8;
  RecyclableObject *callBackFn;
  JavascriptArray *pJVar9;
  JavascriptArray *pJVar10;
  undefined4 *puVar11;
  JavascriptCopyOnAccessNativeIntArray *this;
  JavascriptMethod p_Var12;
  uint64 uVar13;
  uint64 uVar14;
  TypedArrayBase *pTVar15;
  undefined4 extraout_var;
  char16_t *varName;
  uint32 index;
  double dVar16;
  ulong uVar17;
  ulong uVar18;
  JavascriptArray *local_e0;
  undefined1 auStack_d8 [8];
  Var element;
  ScriptContext *local_c8;
  TypedArrayBase *local_c0;
  ScriptContext *local_b8;
  JavascriptArray *local_b0;
  undefined4 *local_a8;
  RecyclableObject *local_a0;
  double local_98;
  undefined4 *local_90;
  JavascriptArray *local_88;
  undefined1 local_80 [8];
  JsReentLock jsReentLock;
  TypedArrayBase *local_58;
  bool local_31 [8];
  bool isBuiltinArrayCtor;
  
  local_80 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_80)->noJsReentrancy;
  ((ThreadContext *)local_80)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_80,pArr);
  local_31[0] = true;
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00baa441:
    varName = L"[TypedArray].prototype.map";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.map";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar8 = Arguments::operator[](args,1);
  bVar5 = JavascriptConversion::IsCallable(pvVar8);
  if (!bVar5) goto LAB_00baa441;
  pvVar8 = Arguments::operator[](args,1);
  callBackFn = VarTo<Js::RecyclableObject>(pvVar8);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    local_a0 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    local_a0 = (RecyclableObject *)Arguments::operator[](args,2);
  }
  local_58 = typedArrayBase;
  if ((pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) &&
     (bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj), bVar5)) {
    local_58 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
  }
  if (typedArrayBase == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pJVar9 = (JavascriptArray *)
             ArraySpeciesCreate<unsigned_long>
                       (obj,length,scriptContext,(bool *)0x0,(bool *)0x0,local_31);
  }
  else {
    pvVar8 = Arguments::operator[](args,0);
    pJVar9 = (JavascriptArray *)TypedArrayBase::GetDefaultConstructor(pvVar8,scriptContext);
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pJVar10 = (JavascriptArray *)
              JavascriptOperators::SpeciesConstructor
                        ((RecyclableObject *)local_58,(JavascriptFunction *)pJVar9,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    *(bool *)((long)local_80 + 0x108) = true;
    local_31[0] = false;
    bVar5 = JavascriptOperators::IsConstructor((RecyclableObject *)pJVar10);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x25cd,"(JavascriptOperators::IsConstructor(constructor))",
                                  "JavascriptOperators::IsConstructor(constructor)");
      if (!bVar5) goto LAB_00baa538;
      *puVar11 = 0;
    }
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pTVar1 = scriptContext->threadContext;
    auStack_d8 = (undefined1  [8])pJVar10;
    element = (Var)length;
    local_c8 = scriptContext;
    if (pJVar10 == pJVar9) {
      bVar5 = pTVar1->reentrancySafeOrHandled;
      pTVar1->reentrancySafeOrHandled = true;
      pvVar8 = anon_func::anon_class_24_1_2f014396::
               anon_class_24_3_af332ec1_for_newObjectCreationFunction::operator()
                         ((anon_class_24_3_af332ec1_for_newObjectCreationFunction *)auStack_d8);
      pTVar1->reentrancySafeOrHandled = bVar5;
    }
    else {
      implicitCall.newObjectCreationFunction.length = length;
      implicitCall.newObjectCreationFunction.constructor = (RecyclableObject *)pJVar10;
      implicitCall.newObjectCreationFunction.scriptContext = scriptContext;
      pvVar8 = ThreadContext::
               ExecuteImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime___Language_JavascriptOperators_inl:168:95)>
                         (pTVar1,(RecyclableObject *)pJVar10,ImplicitCall_Accessor,implicitCall);
    }
    pJVar9 = (JavascriptArray *)VarTo<Js::RecyclableObject>(pvVar8);
    JsReentLock::MutateArrayObject((JsReentLock *)local_80);
  }
  *(bool *)((long)local_80 + 0x108) = true;
  if (pJVar9 == (JavascriptArray *)0x0) {
    if (length >> 0x20 != 0) {
      JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5b,(PCWSTR)0x0);
    }
    pJVar9 = JavascriptLibrary::CreateArray
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,(uint32)length);
    jsReentLock._24_8_ = pJVar9;
    if ((pJVar9->head).ptr == EmptySegment) {
      AllocateHead<void*>(pJVar9);
    }
  }
  else {
    bVar5 = IsNonES5Array(pJVar9);
    if (bVar5) {
      pJVar10 = UnsafeVarTo<Js::JavascriptArray>(pJVar9);
    }
    else {
      pJVar10 = (JavascriptArray *)0x0;
    }
    if (pJVar10 == (JavascriptArray *)0x0) {
      jsReentLock._24_8_ = (JavascriptArray *)0x0;
    }
    else {
      bVar5 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar10);
      if (bVar5) {
        this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar10);
      }
      else {
        this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
      }
      if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
      }
      JsReentLock::setSecondObjectForMutation((JsReentLock *)local_80,pJVar10);
      jsReentLock._24_8_ = pJVar10;
    }
  }
  auStack_d8 = (undefined1  [8])0x0;
  local_88 = pJVar9;
  if (pArr == (JavascriptArray *)0x0) {
    pArr = (JavascriptArray *)0x0;
  }
  else {
    bVar5 = IsNonES5Array(obj);
    if (!bVar5) {
      bVar5 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2602,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar5) goto LAB_00baa538;
        *puVar11 = 0;
      }
      pArr = (JavascriptArray *)0x0;
    }
  }
  local_b8 = scriptContext;
  if (pArr == (JavascriptArray *)0x0) {
    if (local_58 == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pJVar9 = (JavascriptArray *)
               MapObjectHelper<unsigned_long>
                         (obj,length,0,(RecyclableObject *)local_88,
                          (JavascriptArray *)jsReentLock._24_8_,local_31[0],callBackFn,local_a0,
                          scriptContext);
      goto LAB_00baa418;
    }
    bVar5 = VarIsCorrectType<Js::TypedArrayBase>(local_58);
    pJVar9 = local_88;
    if (!bVar5) {
      bVar5 = VarIsCorrectType<Js::TypedArrayBase>(local_58);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2632,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar5) goto LAB_00baa538;
        *puVar11 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)local_88);
    uVar4 = jsReentLock._24_8_;
    if (bVar5) {
      pTVar15 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)pJVar9);
    }
    else {
      pTVar15 = (TypedArrayBase *)0x0;
    }
    if (uVar4 == 0 && pTVar15 == (TypedArrayBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2639,"(newArr != nullptr)","newArr != nullptr");
      if (bVar5) {
        *puVar11 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
LAB_00baa538:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    local_c0 = pTVar15;
    if (length >> 0x20 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x263c,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar5) goto LAB_00baa538;
      *puVar11 = 0;
    }
    uVar18 = (ulong)(local_58->super_ArrayBufferParent).super_ArrayObject.length;
    if (uVar18 < length) {
      length = uVar18;
    }
    if (length != 0) {
      local_90 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar18 = 0;
      do {
        iVar7 = (*(local_58->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(local_58,uVar18 & 0xffffffff);
        auStack_d8 = (undefined1  [8])CONCAT44(extraout_var,iVar7);
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar1 = scriptContext->threadContext;
        bVar5 = pTVar1->reentrancySafeOrHandled;
        pTVar1->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar1);
        if (local_b8->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var12 = RecyclableObject::GetEntryPoint(callBackFn);
        CheckIsExecutable(callBackFn,p_Var12);
        p_Var12 = RecyclableObject::GetEntryPoint(callBackFn);
        local_b0 = (JavascriptArray *)auStack_d8;
        if ((int)uVar18 < 0) {
          local_98 = (double)(uVar18 & 0xffffffff);
          uVar13 = NumberUtilities::ToSpecial(local_98);
          bVar6 = NumberUtilities::IsNan(local_98);
          if (((bVar6) &&
              (uVar14 = NumberUtilities::ToSpecial(local_98), uVar14 != 0xfff8000000000000)) &&
             (uVar14 = NumberUtilities::ToSpecial(local_98), uVar14 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_90 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar6) goto LAB_00baa538;
            *local_90 = 0;
          }
          uVar17 = uVar13 ^ 0xfffc000000000000;
        }
        else {
          uVar17 = uVar18 + 0x1000000000000;
        }
        pvVar8 = (*p_Var12)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,local_a0,
                            local_b0,uVar17,obj);
        pTVar1->reentrancySafeOrHandled = bVar5;
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        scriptContext = local_b8;
        *(bool *)((long)local_80 + 0x108) = true;
        if (local_c0 == (TypedArrayBase *)0x0) {
          (**(code **)(*(long *)jsReentLock._24_8_ + 0x148))
                    (jsReentLock._24_8_,uVar18 & 0xffffffff,pvVar8,0);
        }
        else {
          *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          (*(local_c0->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])(local_c0,uVar18 & 0xffffffff,pvVar8);
          JsReentLock::MutateArrayObject((JsReentLock *)local_80);
          *(bool *)((long)local_80 + 0x108) = true;
        }
        uVar18 = uVar18 + 1;
      } while (length != uVar18);
    }
  }
  else {
    local_b0 = pArr;
    if (length >> 0x20 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2609,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar5) goto LAB_00baa538;
      *puVar11 = 0;
    }
    bVar5 = (length & 0xffffffff) != 0;
    uVar18 = (ulong)bVar5;
    if (bVar5) {
      local_a8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      local_98 = (double)(length & 0xffffffff);
      dVar16 = 0.0;
      do {
        local_c0 = (TypedArrayBase *)CONCAT71(local_c0._1_7_,(char)uVar18);
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        index = SUB84(dVar16,0);
        iVar7 = (*(local_b0->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x71])(local_b0,(ulong)dVar16 & 0xffffffff,auStack_d8);
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        *(bool *)((long)local_80 + 0x108) = true;
        if (iVar7 == 0) {
          iVar7 = 0xc;
        }
        else {
          *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pTVar1 = scriptContext->threadContext;
          bVar5 = pTVar1->reentrancySafeOrHandled;
          pTVar1->reentrancySafeOrHandled = true;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar1);
          if (local_b8->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var12 = RecyclableObject::GetEntryPoint(callBackFn);
          CheckIsExecutable(callBackFn,p_Var12);
          p_Var12 = RecyclableObject::GetEntryPoint(callBackFn);
          auVar3 = auStack_d8;
          if ((int)index < 0) {
            local_90 = (undefined4 *)(double)((ulong)dVar16 & 0xffffffff);
            uVar13 = NumberUtilities::ToSpecial((double)local_90);
            bVar6 = NumberUtilities::IsNan((double)local_90);
            if (((bVar6) &&
                (uVar14 = NumberUtilities::ToSpecial((double)local_90), uVar14 != 0xfff8000000000000
                )) && (uVar14 = NumberUtilities::ToSpecial((double)local_90),
                      uVar14 != 0x7ff8000000000000)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_a8 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar6) goto LAB_00baa538;
              *local_a8 = 0;
            }
            uVar18 = uVar13 ^ 0xfffc000000000000;
          }
          else {
            uVar18 = (long)dVar16 + 0x1000000000000;
          }
          pvVar8 = (*p_Var12)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,local_a0,
                              auVar3,uVar18,local_b0);
          pTVar1->reentrancySafeOrHandled = bVar5;
          JsReentLock::MutateArrayObject((JsReentLock *)local_80);
          scriptContext = local_b8;
          *(bool *)((long)local_80 + 0x108) = true;
          if ((jsReentLock._24_8_ == 0) || (local_31[0] != true)) {
            *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            iVar7 = (*(local_88->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x29])
                              (local_88,(ulong)dVar16 & 0xffffffff,pvVar8);
            ThrowErrorOnFailure(iVar7,scriptContext,index);
            JsReentLock::MutateArrayObject((JsReentLock *)local_80);
            *(bool *)((long)local_80 + 0x108) = true;
          }
          else {
            DirectSetItemAt<void*>((JavascriptArray *)jsReentLock._24_8_,index,pvVar8);
          }
          bVar5 = IsNonES5Array(obj);
          iVar7 = 0;
          if (!bVar5) {
            bVar5 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_a8 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x262b,"(VarIs<ES5Array>(obj))",
                                          "The array should have been converted to an ES5Array");
              if (!bVar5) goto LAB_00baa538;
              *local_a8 = 0;
            }
            *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            local_e0 = (JavascriptArray *)
                       MapObjectHelper<unsigned_long>
                                 (obj,length,(long)dVar16 + 1,(RecyclableObject *)local_88,
                                  (JavascriptArray *)jsReentLock._24_8_,local_31[0],callBackFn,
                                  local_a0,scriptContext);
            iVar7 = 1;
          }
        }
        if ((iVar7 != 0xc) && (iVar7 != 0)) {
          uVar18 = (ulong)local_c0 & 0xff;
          break;
        }
        dVar16 = (double)((long)dVar16 + 1);
        uVar18 = (ulong)((ulong)dVar16 < (ulong)local_98);
      } while (dVar16 != local_98);
    }
    pJVar9 = local_e0;
    if ((uVar18 & 1) != 0) goto LAB_00baa418;
  }
  bVar5 = IsNonES5Array(local_88);
  pJVar9 = local_88;
  if (bVar5) {
    (**(code **)(*(long *)jsReentLock._24_8_ + 0x3a0))();
    pJVar9 = local_88;
  }
LAB_00baa418:
  *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pJVar9;
}

Assistant:

Var JavascriptArray::MapHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        RecyclableObject* newObj = nullptr;
        JavascriptArray* newArr = nullptr;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;
        bool isBuiltinArrayCtor = true;

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (isTypedArrayEntryPoint)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.map"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.map"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        // If the entry point is %TypedArray%.prototype.map or the source object is an Array exotic object we should try to load the constructor property
        // and use it to construct the return object.
        if (isTypedArrayEntryPoint)
        {
            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            JS_REENTRANT(jsReentLock,
                RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext));

            isBuiltinArrayCtor = false;

            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            JS_REENTRANT(jsReentLock,
                newObj = VarTo<RecyclableObject>(
                    JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                    {
                        Js::Var constructorArgs[] = {constructor, JavascriptNumber::ToVar(length, scriptContext) };
                        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), (uint32)length, scriptContext);
                    }));
            )
        }
        // skip the typed array and "pure" array case, we still need to handle special arrays like es5array, remote array, and proxy of array.
        else
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(obj, length, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        }

        if (newObj == nullptr)
        {
            if (length > UINT_MAX)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }
            newArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(length));
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
            }
        }

        Var element = nullptr;
        Var mappedValue = nullptr;
        CallInfo callBackFnInfo = CallInfo(CallFlags_Value, 4);

        // We at least have to have newObj as a valid object
        Assert(newObj);

        // The ArraySpeciesCreate call above could have converted the source array into an ES5Array. If this happens
        // we will process the array elements like an ES5Array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr != nullptr)
        {
            // If source is a JavascriptArray, newObj may or may not be an array based on what was in source's constructor property
            Assert(length <= UINT_MAX);
            for (uint32 k = 0; k < (uint32)length; k++)
            {
                JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(k, &element));
                if (!gotItem)
                {
                    continue;
                }

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newArr is a valid pointer, then we constructed an array to return. Otherwise we need to do generic object operations
                if (newArr && isBuiltinArrayCtor)
                {
                    newArr->DirectSetItemAt(k, mappedValue);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, k, mappedValue), scriptContext, k));
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, k + 1, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase != nullptr)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));

            // Source is a TypedArray, we may have tried to call a constructor, but newObj may not be a TypedArray (or an array either)
            TypedArrayBase* newTypedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);

            if (!newTypedArray)
            {
                AssertAndFailFast(newArr != nullptr);
            }

            Assert(length <= UINT_MAX);
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);
                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newObj is a TypedArray, set the mappedValue directly, otherwise it should be an array, set that item to that array
                if (newTypedArray)
                {
                    JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(k, mappedValue));
                }
                else
                {
                    newArr->SetItem(k, mappedValue, PropertyOperation_None);
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, 0u, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
        }

#ifdef VALIDATE_ARRAY
        if (JavascriptArray::IsNonES5Array(newObj))
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }